

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O1

void Dau_DsdPermute(char *pDsd)

{
  char *pcVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int pPerm [16];
  int aiStack_58 [18];
  
  cVar2 = *pDsd;
  if (cVar2 == '\0') {
    iVar5 = 1;
  }
  else {
    pcVar1 = pDsd + 1;
    iVar5 = 0;
    do {
      bVar3 = cVar2 + 0x9f;
      iVar4 = (int)(char)bVar3;
      if ((char)bVar3 < iVar5) {
        iVar4 = iVar5;
      }
      if (0x19 < bVar3) {
        iVar4 = iVar5;
      }
      iVar5 = iVar4;
      cVar2 = *pcVar1;
      pcVar1 = pcVar1 + 1;
    } while (cVar2 != '\0');
    iVar5 = iVar5 + 1;
  }
  Dau_DsdGenRandPerm(aiStack_58,iVar5);
  cVar2 = *pDsd;
  if (cVar2 != '\0') {
    pcVar1 = pDsd + 1;
    do {
      if (('`' < cVar2) && ((int)cVar2 < iVar5 + 0x61)) {
        pcVar1[-1] = (char)aiStack_58[(int)cVar2 - 0x61] + 'a';
      }
      cVar2 = *pcVar1;
      pcVar1 = pcVar1 + 1;
    } while (cVar2 != '\0');
  }
  return;
}

Assistant:

void Dau_DsdPermute( char * pDsd )
{
    int pPerm[16];
    int nVars = Dau_DsdFindVarNum( pDsd );
    Dau_DsdGenRandPerm( pPerm, nVars );
    pDsd--;
    while ( *++pDsd )
        if ( *pDsd >= 'a' && *pDsd < 'a' + nVars )
            *pDsd = 'a' + pPerm[*pDsd - 'a'];
}